

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_connection_tests.cpp
# Opt level: O3

void __thiscall
net_peer_connection_tests::PeerTest::AddPeer
          (PeerTest *this,NodeId *id,vector<CNode_*,_std::allocator<CNode_*>_> *nodes,
          PeerManager *peerman,ConnmanTestMsg *connman,ConnectionType conn_type,bool onion_peer,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          address)

{
  uint16_t portDefault;
  long lVar1;
  DNSLookupFn dns_lookup_function;
  readonly_property65 rVar2;
  bool bVar3;
  CChainParams *pCVar4;
  uint64_t uVar5;
  CNode *pCVar6;
  ConnmanTestMsg *pCVar7;
  undefined4 in_register_0000008c;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> addr;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  shared_ptr<Sock> sock;
  check_type cVar9;
  CNodeOptions *node_opts;
  RandomMixin<FastRandomContext> *this_00;
  _Manager_type in_stack_fffffffffffffdd8;
  _Invoker_type in_stack_fffffffffffffde0;
  undefined1 local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  assertion_result local_1a0;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  _Any_data local_168;
  code *local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tor_addr;
  direct_or_indirect local_128;
  undefined4 local_118;
  undefined8 local_110;
  uint16_t local_108;
  undefined1 local_100 [16];
  shared_count sStack_f0;
  char **local_e8;
  undefined1 local_e0;
  direct_or_indirect local_d8;
  uint local_c8;
  undefined8 local_c0;
  uint16_t local_b8;
  direct_or_indirect local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  uint16_t local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  direct_or_indirect local_78;
  uint local_68;
  undefined8 local_60;
  uint16_t local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  long local_38;
  
  pvVar8 = (iterator)CONCAT44(in_register_0000008c,conn_type);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = connman;
  CService::CService((CService *)&local_78.indirect_contents);
  local_50 = 100000000;
  uStack_48 = 0;
  if (*(char *)((long)address.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p + 0x20) == '\x01') {
    pCVar4 = Params();
    portDefault = pCVar4->nDefaultPort;
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_168,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._8_4_ = conn_type;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_function_pointer =
         (_func_void *)this;
    dns_lookup_function.super__Function_base._M_functor._12_4_ = in_register_0000008c;
    dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffffdd8;
    dns_lookup_function._M_invoker = in_stack_fffffffffffffde0;
    LookupNumeric((CService *)local_100,
                  (string *)
                  address.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p,portDefault,dns_lookup_function);
    MaybeFlipIPv6toCJDNS((CService *)&local_d8.indirect_contents,(CService *)local_100);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b0,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents);
    local_a0._8_8_ = local_c0;
    local_90 = local_b8;
    local_88 = 100000000;
    uStack_80 = 0;
    if (0x10 < local_68) {
      free(local_78.indirect_contents.indirect);
    }
    local_78.indirect_contents.indirect = local_b0.indirect_contents.indirect;
    local_68 = local_a0._M_allocated_capacity._0_4_;
    local_a0._M_allocated_capacity = local_a0._M_allocated_capacity & 0xffffffff00000000;
    local_50 = local_88;
    uStack_48 = uStack_80;
    local_60 = local_a0._8_8_;
    local_58 = local_90;
    if (0x10 < local_c8) {
      free(local_d8.indirect_contents.indirect);
      local_d8.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < (uint)sStack_f0.pi_) {
      free((void *)local_100._0_8_);
      local_100._0_8_ = (undefined **)0x0;
    }
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,__destroy_functor);
    }
  }
  else if (onion_peer) {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&tor_addr,
               &(this->super_LogIPsTestingSetup).super_TestingSetup.super_ChainTestingSetup.
                super_BasicTestingSetup.m_rng.super_RandomMixin<FastRandomContext>,0x20);
    local_178 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_170 = "";
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x38;
    file.m_begin = (iterator)&local_178;
    msg.m_end = pvVar8;
    msg.m_begin = (iterator)pCVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
    addr.m_size = (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    addr.m_data = tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    OnionToString_abi_cxx11_((string *)&local_b0,addr);
    _cVar9 = 0x4995a5;
    rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         CNetAddr::SetSpecial((CNetAddr *)&local_78.indirect_contents,(string *)&local_b0);
    local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
    local_1a0.m_message.px = (element_type *)0x0;
    local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e8 = &local_1b0;
    local_1b0 = "addr.SetSpecial(OnionToString(tor_addr))";
    local_1a8 = "";
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_013ae1c8;
    sStack_f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_1b8 = "";
    pCVar7 = (ConnmanTestMsg *)0x2;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1a0,(lazy_ostream *)local_100,2,0,WARN,_cVar9,(size_t)&local_1c0,0x38);
    boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.indirect_contents.indirect != &local_a0) {
      operator_delete(local_b0.indirect_contents.indirect,local_a0._M_allocated_capacity + 1);
    }
    if (tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)tor_addr.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)tor_addr.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  this_00 = &(this->super_LogIPsTestingSetup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_rng.super_RandomMixin<FastRandomContext>;
  while( true ) {
    bVar3 = CNetAddr::IsLocal((CNetAddr *)&local_78.indirect_contents);
    if (bVar3) break;
    bVar3 = CNetAddr::IsRoutable((CNetAddr *)&local_78.indirect_contents);
    if (bVar3) break;
    uVar5 = RandomMixin<FastRandomContext>::randbits(this_00,0x20);
    tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(tor_addr.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,(int)uVar5);
    CNetAddr::CNetAddr((CNetAddr *)local_100,(in_addr *)&tor_addr);
    pCVar4 = Params();
    CService::CService((CService *)&local_128.indirect_contents,(CNetAddr *)local_100,
                       pCVar4->nDefaultPort);
    if (0x10 < (uint)sStack_f0.pi_) {
      free((void *)local_100._0_8_);
    }
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b0,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents);
    local_a0._8_8_ = local_110;
    local_90 = local_108;
    local_88 = 100000000;
    uStack_80 = 0;
    if (0x10 < local_68) {
      free(local_78.indirect_contents.indirect);
    }
    local_78.indirect_contents.indirect = local_b0.indirect_contents.indirect;
    local_68 = local_a0._M_allocated_capacity._0_4_;
    local_a0._M_allocated_capacity = local_a0._M_allocated_capacity & 0xffffffff00000000;
    local_50 = local_88;
    uStack_48 = uStack_80;
    local_60 = local_a0._8_8_;
    local_58 = local_90;
    if (0x10 < (uint)local_118) {
      free(local_128.indirect_contents.indirect);
      local_128.indirect_contents.indirect = (char *)0x0;
    }
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3f;
  file_00.m_begin = (iterator)&local_1d0;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = (iterator)pCVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e0,
             msg_00);
  _cVar9 = 0x499848;
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_100[0] = bVar3;
  local_100._8_8_ = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "addr.IsValid()";
  tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_b0.direct[8] = '\0';
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_1e8 = "";
  local_a0._8_8_ = &tor_addr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&local_b0,2,0,WARN,_cVar9,
             (size_t)&local_1f0,0x3f);
  boost::detail::shared_count::~shared_count(&sStack_f0);
  bVar3 = conn_type == INBOUND;
  pCVar6 = (CNode *)operator_new(0x3a8);
  lVar1 = *id;
  *id = lVar1 + 1;
  local_208 = (undefined1  [8])0x0;
  p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CService::CService((CService *)&local_b0);
  local_88 = 100000000;
  uStack_80 = 0;
  tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  node_opts = (CNodeOptions *)0x49994f;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tor_addr,"");
  local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
  local_100._8_8_ = 0;
  sStack_f0.pi_ = sStack_f0.pi_ & 0xffffffffffffff00;
  local_e8 = (char **)0x4c4b40;
  local_e0 = 0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_208;
  CNode::CNode(pCVar6,lVar1 + 1,sock,(CAddress *)0x0,0,(uint64_t)&local_b0,(CAddress *)&tor_addr,
               (string *)CONCAT44(in_register_0000008c,conn_type),(uint)(bVar3 && onion_peer),false,
               node_opts);
  local_1a0._0_8_ = pCVar6;
  std::vector<CNode*,std::allocator<CNode*>>::emplace_back<CNode*>
            ((vector<CNode*,std::allocator<CNode*>> *)nodes,(CNode **)&local_1a0);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             (local_100 + 8));
  if ((pointer *)
      tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(tor_addr.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (0x10 < (uint)local_a0._M_allocated_capacity._0_4_) {
    free(local_b0.indirect_contents.indirect);
  }
  if (p_Stack_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_200);
  }
  pCVar6 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
           super__Vector_impl_data._M_finish[-1];
  LOCK();
  (pCVar6->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (**(peerman->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&peerman->super_NetEventsInterface,pCVar6,9);
  LOCK();
  (pCVar6->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode(connman,pCVar6);
  if (0x10 < local_68) {
    free(local_78.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddPeer(NodeId& id, std::vector<CNode*>& nodes, PeerManager& peerman, ConnmanTestMsg& connman, ConnectionType conn_type, bool onion_peer = false, std::optional<std::string> address = std::nullopt)
{
    CAddress addr{};

    if (address.has_value()) {
        addr = CAddress{MaybeFlipIPv6toCJDNS(LookupNumeric(address.value(), Params().GetDefaultPort())), NODE_NONE};
    } else if (onion_peer) {
        auto tor_addr{m_rng.randbytes(ADDR_TORV3_SIZE)};
        BOOST_REQUIRE(addr.SetSpecial(OnionToString(tor_addr)));
    }

    while (!addr.IsLocal() && !addr.IsRoutable()) {
        addr = CAddress{ip(m_rng.randbits(32)), NODE_NONE};
    }

    BOOST_REQUIRE(addr.IsValid());

    const bool inbound_onion{onion_peer && conn_type == ConnectionType::INBOUND};

    nodes.emplace_back(new CNode{++id,
                                 /*sock=*/nullptr,
                                 addr,
                                 /*nKeyedNetGroupIn=*/0,
                                 /*nLocalHostNonceIn=*/0,
                                 CAddress{},
                                 /*addrNameIn=*/"",
                                 conn_type,
                                 /*inbound_onion=*/inbound_onion});
    CNode& node = *nodes.back();
    node.SetCommonVersion(PROTOCOL_VERSION);

    peerman.InitializeNode(node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node.fSuccessfullyConnected = true;

    connman.AddTestNode(node);
}